

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar32 icu_63::anon_unknown_15::previousHangulOrJamo(uint8_t *start,uint8_t *p)

{
  byte bVar1;
  byte bVar2;
  uint8_t t2;
  uint8_t t1;
  uint8_t l;
  uint8_t *p_local;
  uint8_t *start_local;
  
  if (((((long)p - (long)start < 3) || (bVar1 = p[-3], bVar1 < 0xe1)) || (0xed < bVar1)) ||
     (((bVar2 = p[-2] + 0x80, 0x3f < bVar2 || (0x3f < (byte)(p[-1] + 0x80))) ||
      ((0xec < bVar1 && (0x1f < bVar2)))))) {
    start_local._4_4_ = 0xffffffff;
  }
  else {
    start_local._4_4_ = (bVar1 & 0xf) << 0xc | (uint)bVar2 << 6 | (uint)(byte)(p[-1] + 0x80);
  }
  return start_local._4_4_;
}

Assistant:

UChar32 previousHangulOrJamo(const uint8_t *start, const uint8_t *p) {
    if ((p - start) >= 3) {
        p -= 3;
        uint8_t l = *p;
        uint8_t t1, t2;
        if (0xe1 <= l && l <= 0xed &&
                (t1 = (uint8_t)(p[1] - 0x80)) <= 0x3f &&
                (t2 = (uint8_t)(p[2] - 0x80)) <= 0x3f &&
                (l < 0xed || t1 <= 0x1f)) {
            return ((l & 0xf) << 12) | (t1 << 6) | t2;
        }
    }
    return U_SENTINEL;
}